

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

CURLcode cf_h2_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  long *plVar1;
  long lVar2;
  CURLcode CVar3;
  long *plVar4;
  ulong uVar5;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  plVar1 = (long *)cf->ctx;
  plVar4 = plVar1;
  if ((cf->next->field_0x24 & 1) == 0) {
    CVar3 = Curl_conn_cf_connect(cf->next,data,blocking,done);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    if (*done != true) {
      return CURLE_OK;
    }
    plVar4 = (long *)cf->ctx;
  }
  *done = false;
  lVar2 = plVar4[2];
  plVar4[2] = (long)data;
  if (((*plVar1 == 0) && (CVar3 = cf_h2_ctx_init(cf,data,false), CVar3 != CURLE_OK)) ||
     (CVar3 = h2_progress_ingress(cf,data), CVar3 != CURLE_OK)) {
    uVar5 = (ulong)CVar3;
  }
  else {
    CVar3 = h2_progress_egress(cf,data);
    if ((CVar3 == CURLE_AGAIN) || (uVar5 = (ulong)CVar3, CVar3 == CURLE_OK)) {
      *done = true;
      cf->field_0x24 = cf->field_0x24 | 1;
      uVar5 = 0;
    }
  }
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"cf_connect() -> %d, %d, ",uVar5,(ulong)*done);
  }
  *(long *)((long)cf->ctx + 0x10) = lVar2;
  return (CURLcode)uVar5;
}

Assistant:

static CURLcode cf_h2_connect(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool blocking, bool *done)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;
  struct cf_call_data save;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* Connect the lower filters first */
  if(!cf->next->connected) {
    result = Curl_conn_cf_connect(cf->next, data, blocking, done);
    if(result || !*done)
      return result;
  }

  *done = FALSE;

  CF_DATA_SAVE(save, cf, data);
  if(!ctx->h2) {
    result = cf_h2_ctx_init(cf, data, FALSE);
    if(result)
      goto out;
  }

  result = h2_progress_ingress(cf, data);
  if(result)
    goto out;

  /* Send out our SETTINGS and ACKs and such. If that blocks, we
   * have it buffered and  can count this filter as being connected */
  result = h2_progress_egress(cf, data);
  if(result == CURLE_AGAIN)
    result = CURLE_OK;
  else if(result)
    goto out;

  *done = TRUE;
  cf->connected = TRUE;
  result = CURLE_OK;

out:
  CURL_TRC_CF(data, cf, "cf_connect() -> %d, %d, ", result, *done);
  CF_DATA_RESTORE(cf, save);
  return result;
}